

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_quantize.c
# Opt level: O0

void av1_quantize_lp_c(int16_t *coeff_ptr,intptr_t n_coeffs,int16_t *round_ptr,int16_t *quant_ptr,
                      int16_t *qcoeff_ptr,int16_t *dqcoeff_ptr,int16_t *dequant_ptr,
                      uint16_t *eob_ptr,int16_t *scan,int16_t *iscan)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  void *in_R8;
  void *in_R9;
  long in_stack_00000008;
  int tmp;
  int abs_coeff;
  int coeff_sign;
  int coeff;
  int rc;
  int i;
  int eob;
  undefined4 local_38;
  undefined4 local_34;
  
  local_34 = -1;
  memset(in_R8,0,in_RSI << 1);
  memset(in_R9,0,in_RSI << 1);
  for (local_38 = 0; local_38 < in_RSI; local_38 = local_38 + 1) {
    iVar1 = (int)*(short *)(_coeff + (long)local_38 * 2);
    uVar2 = (uint)*(short *)(in_RDI + (long)iVar1 * 2);
    uVar3 = 0;
    if ((int)uVar2 < 0) {
      uVar3 = 0xffffffff;
    }
    iVar4 = clamp(((uVar2 ^ uVar3) - uVar3) +
                  (int)*(short *)(in_RDX + (long)(int)(uint)(iVar1 != 0) * 2),-0x8000,0x7fff);
    iVar4 = iVar4 * *(short *)(in_RCX + (long)(int)(uint)(iVar1 != 0) * 2);
    *(ushort *)((long)in_R8 + (long)iVar1 * 2) =
         ((ushort)((uint)iVar4 >> 0x10) ^ (ushort)uVar3) - (ushort)uVar3;
    *(short *)((long)in_R9 + (long)iVar1 * 2) =
         *(short *)((long)in_R8 + (long)iVar1 * 2) *
         *(short *)(in_stack_00000008 + (long)(int)(uint)(iVar1 != 0) * 2);
    if (iVar4 >> 0x10 != 0) {
      local_34 = local_38;
    }
  }
  *_abs_coeff = (short)local_34 + 1;
  return;
}

Assistant:

void av1_quantize_lp_c(const int16_t *coeff_ptr, intptr_t n_coeffs,
                       const int16_t *round_ptr, const int16_t *quant_ptr,
                       int16_t *qcoeff_ptr, int16_t *dqcoeff_ptr,
                       const int16_t *dequant_ptr, uint16_t *eob_ptr,
                       const int16_t *scan, const int16_t *iscan) {
  (void)iscan;
  int eob = -1;

  memset(qcoeff_ptr, 0, n_coeffs * sizeof(*qcoeff_ptr));
  memset(dqcoeff_ptr, 0, n_coeffs * sizeof(*dqcoeff_ptr));

  // Quantization pass: All coefficients with index >= zero_flag are
  // skippable. Note: zero_flag can be zero.
  for (int i = 0; i < n_coeffs; i++) {
    const int rc = scan[i];
    const int coeff = coeff_ptr[rc];
    const int coeff_sign = AOMSIGN(coeff);
    const int abs_coeff = (coeff ^ coeff_sign) - coeff_sign;

    int tmp = clamp(abs_coeff + round_ptr[rc != 0], INT16_MIN, INT16_MAX);
    tmp = (tmp * quant_ptr[rc != 0]) >> 16;

    qcoeff_ptr[rc] = (tmp ^ coeff_sign) - coeff_sign;
    dqcoeff_ptr[rc] = qcoeff_ptr[rc] * dequant_ptr[rc != 0];

    if (tmp) eob = i;
  }
  *eob_ptr = eob + 1;
}